

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O2

int luaB_coresume(lua_State *L)

{
  int iVar1;
  uint uVar2;
  lua_State *co;
  
  co = lua_tothread(L,1);
  if (co == (lua_State *)0x0) {
    luaL_argerror(L,1,"coroutine expected");
  }
  iVar1 = lua_gettop(L);
  uVar2 = auxresume(L,co,iVar1 + -1);
  if ((int)uVar2 < 0) {
    lua_pushboolean(L,0);
    iVar1 = 2;
    uVar2 = 0xfffffffe;
  }
  else {
    lua_pushboolean(L,1);
    iVar1 = uVar2 + 1;
    uVar2 = ~uVar2;
  }
  lua_insert(L,uVar2);
  return iVar1;
}

Assistant:

static int luaB_coresume (lua_State *L) {
  lua_State *co = lua_tothread(L, 1);
  int r;
  luaL_argcheck(L, co, 1, "coroutine expected");
  r = auxresume(L, co, lua_gettop(L) - 1);
  if (r < 0) {
    lua_pushboolean(L, 0);
    lua_insert(L, -2);
    return 2;  /* return false + error message */
  }
  else {
    lua_pushboolean(L, 1);
    lua_insert(L, -(r + 1));
    return r + 1;  /* return true + `resume' returns */
  }
}